

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O2

void av1_calc_indices_dim2_c
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *dist,int n,int k)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int16_t *p2;
  ulong uVar4;
  int j;
  long lVar5;
  
  if (dist != (int64_t *)0x0) {
    *dist = 0;
  }
  uVar4 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar4;
  }
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    iVar1 = calc_dist_dim2(data + uVar4 * 2,centroids);
    indices[uVar4] = '\0';
    p2 = centroids + 2;
    for (lVar5 = 1; lVar5 < k; lVar5 = lVar5 + 1) {
      iVar2 = calc_dist_dim2(data + uVar4 * 2,p2);
      if (iVar2 < iVar1) {
        indices[uVar4] = (uint8_t)lVar5;
        iVar1 = iVar2;
      }
      p2 = p2 + 2;
    }
    if (dist != (int64_t *)0x0) {
      *dist = *dist + (long)iVar1;
    }
  }
  return;
}

Assistant:

void RENAME_C(av1_calc_indices)(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *dist, int n, int k) {
  if (dist) {
    *dist = 0;
  }
  for (int i = 0; i < n; ++i) {
    int min_dist = RENAME(calc_dist)(data + i * AV1_K_MEANS_DIM, centroids);
    indices[i] = 0;
    for (int j = 1; j < k; ++j) {
      const int this_dist = RENAME(calc_dist)(data + i * AV1_K_MEANS_DIM,
                                              centroids + j * AV1_K_MEANS_DIM);
      if (this_dist < min_dist) {
        min_dist = this_dist;
        indices[i] = j;
      }
    }
    if (dist) {
#if AV1_K_MEANS_DIM == 1
      *dist += min_dist * min_dist;
#else
      *dist += min_dist;
#endif
    }
  }
}